

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::MakeTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  ushort *puVar1;
  Options *opts_00;
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls;
  bool bVar2;
  OneofDescriptor *pOVar3;
  char *pcVar4;
  undefined1 in_CL;
  int extraout_EDX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  int extraout_EDX_00;
  int __c;
  FieldDescriptor *field_02;
  optional<int> field_index;
  Getters *__s;
  cpp *this;
  string *psVar5;
  Call *in_R8;
  Arg *in_R9;
  Call *this_00;
  long lVar6;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view input;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view var;
  string_view format_07;
  string_view var_00;
  string_view format_08;
  string_view var_01;
  string_view format_09;
  string_view var_02;
  string_view format_10;
  string_view var_03;
  string_view format_11;
  string_view var_04;
  string_view format_12;
  string_view var_05;
  string_view format_13;
  string_view var_06;
  string_view format_14;
  string_view var_07;
  string_view format_15;
  string_view var_08;
  string_view format_16;
  string_view var_09;
  string_view format_17;
  string_view call;
  string_view call_00;
  string_view call_01;
  string_view call_02;
  string_view call_03;
  string_view call_04;
  string_view call_05;
  string_view call_06;
  string_view call_07;
  string_view call_08;
  string_view call_09;
  Getters getters;
  string member_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  string accessor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_868;
  Call local_848;
  string field_ptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a8;
  Call local_788;
  string local_728;
  string local_708;
  string has;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a8;
  undefined1 local_688 [40];
  string default_field;
  Call local_600;
  Getters getters_1;
  Call local_540;
  Call local_4e0;
  Call local_480;
  Call local_420;
  Call local_3c0;
  Call local_360;
  Call local_300;
  Call local_2a0;
  Call local_240;
  Call local_1e0;
  Call local_180;
  Call local_120;
  Call local_c0;
  size_type local_60;
  pointer local_58;
  
  __s = (Getters *)field;
  anon_unknown_0::Getters::Getters(&getters);
  bVar2 = FieldDescriptor::is_repeated(field);
  if (bVar2) {
    anon_unknown_0::Getters::Getters(&getters_1);
    bVar2 = FieldDescriptor::is_map(field);
    if ((!bVar2) && (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10))
    {
      local_848.var = absl::lts_20250127::NullSafeStringView("_internal_");
      FieldName_abi_cxx11_(&field_ptr,(cpp *)field,(FieldDescriptor *)local_848.var._M_str);
      local_788.var._M_len = field_ptr._M_string_length;
      local_788.var._M_str = field_ptr._M_dataplus._M_p;
      member_1._0_16_ = absl::lts_20250127::NullSafeStringView("()");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&accessor,(lts_20250127 *)&local_848,(AlphaNum *)&local_788,(AlphaNum *)&member_1,
                 (AlphaNum *)in_R8);
      std::__cxx11::string::~string((string *)&field_ptr);
      format._M_str = (char *)&local_848;
      format._M_len = (size_t)"&$0.Get(index)";
      absl::lts_20250127::Substitute_abi_cxx11_
                ((string *)&local_788,(lts_20250127 *)&DAT_0000000e,format,(Arg *)in_R8);
      std::__cxx11::string::operator=((string *)&getters_1,(string *)&local_788);
      std::__cxx11::string::~string((string *)&local_788);
      format_00._M_str = (char *)&local_848;
      format_00._M_len = (size_t)"&$0.Get($0.size() - 1)";
      absl::lts_20250127::Substitute_abi_cxx11_
                ((string *)&local_788,(lts_20250127 *)0x16,format_00,(Arg *)in_R8);
      std::__cxx11::string::operator=((string *)&getters_1.for_last,(string *)&local_788);
      std::__cxx11::string::~string((string *)&local_788);
      local_848.var = absl::lts_20250127::NullSafeStringView("&");
      local_788.var._M_len = accessor._M_string_length;
      local_788.var._M_str = accessor._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&member_1,(lts_20250127 *)&local_848,(AlphaNum *)&local_788,
                 (AlphaNum *)accessor._M_string_length);
      psVar5 = &member_1;
      std::__cxx11::string::operator=((string *)&getters_1.for_flat,(string *)psVar5);
LAB_00b39755:
      std::__cxx11::string::~string((string *)psVar5);
      psVar5 = &accessor;
      goto LAB_00b39762;
    }
  }
  else {
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
      bVar2 = IsExplicitLazy(field);
      __c = extraout_EDX;
      if (!bVar2) goto LAB_00b39782;
LAB_00b39453:
      bVar2 = ShouldSplit(field,opts);
      FieldMemberName_abi_cxx11_(&member_1,(cpp *)field,(FieldDescriptor *)(ulong)bVar2,(bool)in_CL)
      ;
      anon_unknown_0::Getters::Getters(&getters_1);
      local_848.var = absl::lts_20250127::NullSafeStringView("&");
      local_788.var._M_len = member_1._M_string_length;
      local_788.var._M_str = member_1._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&accessor,(lts_20250127 *)&local_848,(AlphaNum *)&local_788,
                 (AlphaNum *)member_1._M_string_length);
      std::__cxx11::string::operator=((string *)&getters_1,(string *)&accessor);
      std::__cxx11::string::~string((string *)&accessor);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        local_848.var = absl::lts_20250127::NullSafeStringView("&");
        local_788.var._M_len = member_1._M_string_length;
        local_788.var._M_str = member_1._M_dataplus._M_p;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&accessor,(lts_20250127 *)&local_848,(AlphaNum *)&local_788,
                   (AlphaNum *)member_1._M_string_length);
        std::__cxx11::string::operator=((string *)&getters_1.for_flat,(string *)&accessor);
        std::__cxx11::string::~string((string *)&accessor);
      }
    }
    else {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9)
      goto LAB_00b39453;
      pOVar3 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar3 != (OneofDescriptor *)0x0) {
        bVar2 = ShouldSplit(field,opts);
        FieldMemberName_abi_cxx11_
                  (&accessor,(cpp *)field,(FieldDescriptor *)(ulong)bVar2,(bool)in_CL);
        std::__cxx11::string::string((string *)&field_ptr,(string *)&accessor);
        bVar2 = IsArenaStringPtr(field,opts);
        if (bVar2) {
          format_01._M_str = (char *)&local_848;
          format_01._M_len = (size_t)"$0.UnsafeGetPointer()";
          absl::lts_20250127::Substitute_abi_cxx11_
                    ((string *)&local_788,(lts_20250127 *)0x15,format_01,(Arg *)in_R8);
          std::__cxx11::string::operator=((string *)&field_ptr,(string *)&local_788);
          std::__cxx11::string::~string((string *)&local_788);
        }
        puVar1 = (ushort *)(pOVar3->all_names_).payload_;
        local_848.var._M_len = (size_t)*puVar1;
        local_848.var._M_str = (char *)((long)puVar1 + ~local_848.var._M_len);
        puVar1 = (ushort *)(field->all_names_).payload_;
        this = (cpp *)(ulong)*puVar1;
        input._M_len = (long)puVar1 + ~(ulong)this;
        input._M_str = (char *)0x1;
        UnderscoresToCamelCase_abi_cxx11_(&member_1,this,input,SUB81(in_R8,0));
        local_788.var._M_len = member_1._M_string_length;
        local_788.var._M_str = member_1._M_dataplus._M_p;
        format_02._M_str = (char *)&local_848;
        format_02._M_len = (size_t)"$0_case() == k$1";
        absl::lts_20250127::Substitute_abi_cxx11_
                  (&has,(lts_20250127 *)&DAT_00000010,format_02,(Arg *)&local_788,in_R9);
        std::__cxx11::string::~string((string *)&member_1);
        MakeDefaultFieldName_abi_cxx11_(&default_field,(cpp *)field,field_00);
        bVar2 = IsArenaStringPtr(field,opts);
        if (bVar2) {
          local_848.var = absl::lts_20250127::NullSafeStringView(".get()");
          absl::lts_20250127::StrAppend(&default_field,(AlphaNum *)&local_848);
        }
        anon_unknown_0::Getters::Getters(&getters_1);
        if (((field->field_20).default_value_enum_)->all_names_ == (string *)0x0) {
          local_848.var._M_str = has._M_dataplus._M_p;
          local_848.var._M_len = has._M_string_length;
          in_R8 = &local_788;
          local_788.var._M_len = field_ptr._M_string_length;
          local_788.var._M_str = field_ptr._M_dataplus._M_p;
          format_05._M_str = (char *)&local_848;
          format_05._M_len = (size_t)"$0 ? $1 : nullptr";
          absl::lts_20250127::Substitute_abi_cxx11_
                    (&member_1,(lts_20250127 *)&DAT_00000011,format_05,(Arg *)in_R8,in_R9);
          this_00 = (Call *)&member_1;
        }
        else {
          local_848.var._M_str = has._M_dataplus._M_p;
          local_848.var._M_len = has._M_string_length;
          in_R8 = &local_788;
          local_788.var._M_len = field_ptr._M_string_length;
          local_788.var._M_str = field_ptr._M_dataplus._M_p;
          member_1._M_string_length = (size_type)default_field._M_dataplus._M_p;
          member_1._M_dataplus._M_p = (pointer)default_field._M_string_length;
          format_03._M_str = (char *)&local_848;
          format_03._M_len = (size_t)"$0 ? $1 : &$2";
          absl::lts_20250127::Substitute_abi_cxx11_
                    ((string *)&local_600,(lts_20250127 *)&DAT_0000000d,format_03,(Arg *)in_R8,
                     (Arg *)&member_1,(Arg *)getters.base._M_dataplus._M_p);
          this_00 = &local_600;
        }
        std::__cxx11::string::operator=((string *)&getters_1,(string *)this_00);
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::_M_assign((string *)&getters_1.for_flat);
        std::__cxx11::string::~string((string *)&default_field);
        std::__cxx11::string::~string((string *)&has);
        psVar5 = &field_ptr;
        goto LAB_00b39755;
      }
      bVar2 = ShouldSplit(field,opts);
      FieldMemberName_abi_cxx11_(&member_1,(cpp *)field,(FieldDescriptor *)(ulong)bVar2,(bool)in_CL)
      ;
      anon_unknown_0::Getters::Getters(&getters_1);
      bVar2 = IsArenaStringPtr(field,opts);
      if ((bVar2) && (((field->field_20).default_value_enum_)->all_names_ != (string *)0x0)) {
        local_848.var._M_str = member_1._M_dataplus._M_p;
        local_848.var._M_len = member_1._M_string_length;
        MakeDefaultFieldName_abi_cxx11_(&field_ptr,(cpp *)field,field_01);
        in_R8 = &local_788;
        local_788.var._M_len = field_ptr._M_string_length;
        local_788.var._M_str = field_ptr._M_dataplus._M_p;
        format_04._M_str = (char *)&local_848;
        format_04._M_len = (size_t)"$0.IsDefault() ? &$1.get() : $0.UnsafeGetPointer()";
        absl::lts_20250127::Substitute_abi_cxx11_
                  (&accessor,(lts_20250127 *)0x32,format_04,(Arg *)in_R8,in_R9);
        std::__cxx11::string::operator=((string *)&getters_1,(string *)&accessor);
        std::__cxx11::string::~string((string *)&accessor);
        psVar5 = &field_ptr;
      }
      else {
        local_848.var = absl::lts_20250127::NullSafeStringView("&");
        local_788.var._M_len = member_1._M_string_length;
        local_788.var._M_str = member_1._M_dataplus._M_p;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&accessor,(lts_20250127 *)&local_848,(AlphaNum *)&local_788,
                   (AlphaNum *)member_1._M_string_length);
        psVar5 = &accessor;
        std::__cxx11::string::operator=((string *)&getters_1,(string *)psVar5);
      }
      std::__cxx11::string::~string((string *)psVar5);
      std::__cxx11::string::_M_assign((string *)&getters_1.for_flat);
    }
    psVar5 = &member_1;
LAB_00b39762:
    std::__cxx11::string::~string((string *)psVar5);
  }
  __s = &getters_1;
  anon_unknown_0::Getters::operator=(&getters,&getters_1);
  anon_unknown_0::Getters::~Getters(&getters_1);
  __c = extraout_EDX_00;
LAB_00b39782:
  pcVar4 = FieldDescriptor::index(field,(char *)__s,__c);
  opts_00 = (Options *)field->containing_type_;
  FieldName_abi_cxx11_(&local_728,(cpp *)field,field_02);
  local_60 = local_728._M_string_length;
  local_58 = local_728._M_dataplus._M_p;
  format_06._M_str = (char *)&local_60;
  format_06._M_len = (size_t)"$0_AccessedNoStrip = true;";
  absl::lts_20250127::Substitute_abi_cxx11_(&local_708,(lts_20250127 *)0x1a,format_06,(Arg *)in_R8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_688,&local_708);
  field_index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)((ulong)pcVar4 & 0xffffffff | 0x100000000);
  var._M_str = "get";
  var._M_len = 3;
  call._M_str = "OnGet";
  call._M_len = 5;
  anon_unknown_0::Call::Call(&local_848,field_index,var,call);
  format_07._M_str = getters.base._M_dataplus._M_p;
  format_07._M_len = getters.base._M_string_length;
  anon_unknown_0::Call::Arg<>((Call *)&getters_1,&local_848,format_07);
  var_00._M_str = "set";
  var_00._M_len = 3;
  call_00._M_str = "OnSet";
  call_00._M_len = 5;
  anon_unknown_0::Call::Call(&local_788,field_index,var_00,call_00);
  format_08._M_str = getters.base._M_dataplus._M_p;
  format_08._M_len = getters.base._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_540,&local_788,format_08);
  var_01._M_str = "has";
  var_01._M_len = 3;
  call_01._M_str = "OnHas";
  call_01._M_len = 5;
  anon_unknown_0::Call::Call((Call *)&member_1,field_index,var_01,call_01);
  format_09._M_str = getters.base._M_dataplus._M_p;
  format_09._M_len = getters.base._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_4e0,(Call *)&member_1,format_09);
  var_02._M_str = "mutable";
  var_02._M_len = 7;
  call_02._M_str = "OnMutable";
  call_02._M_len = 9;
  anon_unknown_0::Call::Call((Call *)&accessor,field_index,var_02,call_02);
  format_10._M_str = getters.base._M_dataplus._M_p;
  format_10._M_len = getters.base._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_480,(Call *)&accessor,format_10);
  var_03._M_str = "release";
  var_03._M_len = 7;
  call_03._M_str = "OnRelease";
  call_03._M_len = 9;
  anon_unknown_0::Call::Call((Call *)&field_ptr,field_index,var_03,call_03);
  format_11._M_str = getters.base._M_dataplus._M_p;
  format_11._M_len = getters.base._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_420,(Call *)&field_ptr,format_11);
  var_04._M_str = "clear";
  var_04._M_len = 5;
  call_04._M_str = "OnClear";
  call_04._M_len = 7;
  anon_unknown_0::Call::Call((Call *)&has,field_index,var_04,call_04);
  format_12._M_str = getters.for_flat._M_dataplus._M_p;
  format_12._M_len = getters.for_flat._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_3c0,(Call *)&has,format_12);
  var_05._M_str = "size";
  var_05._M_len = 4;
  call_05._M_str = "OnSize";
  call_05._M_len = 6;
  anon_unknown_0::Call::Call((Call *)&default_field,field_index,var_05,call_05);
  format_13._M_str = getters.for_flat._M_dataplus._M_p;
  format_13._M_len = getters.for_flat._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_360,(Call *)&default_field,format_13);
  var_06._M_str = "list";
  var_06._M_len = 4;
  call_06._M_str = "OnList";
  call_06._M_len = 6;
  anon_unknown_0::Call::Call(&local_600,field_index,var_06,call_06);
  format_14._M_str = getters.for_flat._M_dataplus._M_p;
  format_14._M_len = getters.for_flat._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_300,&local_600,format_14);
  var_07._M_str = "mutable_list";
  var_07._M_len = 0xc;
  call_07._M_str = "OnMutableList";
  call_07._M_len = 0xd;
  anon_unknown_0::Call::Call(&local_c0,field_index,var_07,call_07);
  format_15._M_str = getters.for_flat._M_dataplus._M_p;
  format_15._M_len = getters.for_flat._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_2a0,&local_c0,format_15);
  var_08._M_str = "add";
  var_08._M_len = 3;
  call_08._M_str = "OnAdd";
  call_08._M_len = 5;
  anon_unknown_0::Call::Call(&local_120,field_index,var_08,call_08);
  format_16._M_str = getters.for_last._M_dataplus._M_p;
  format_16._M_len = getters.for_last._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_240,&local_120,format_16);
  var_09._M_str = "add_mutable";
  var_09._M_len = 0xb;
  call_09._M_str = "OnAddMutable";
  call_09._M_len = 0xc;
  anon_unknown_0::Call::Call(&local_180,field_index,var_09,call_09);
  format_17._M_str = getters.for_last._M_dataplus._M_p;
  format_17._M_len = getters.for_last._M_string_length;
  anon_unknown_0::Call::Arg<>(&local_1e0,&local_180,format_17);
  calls.len_ = getters.base._M_string_length;
  calls.ptr_ = (pointer)getters.base._M_dataplus._M_p;
  anon_unknown_0::GenerateTrackerCalls
            (__return_storage_ptr__,(anon_unknown_0 *)opts,opts_00,(Descriptor *)local_688,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&getters_1,calls);
  lVar6 = 0x400;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&getters_1.base._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x60;
  } while (lVar6 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_600.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff9e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_868);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_788.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_848.args);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_688);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_728);
  anon_unknown_0::Getters::~Getters(&getters);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeTrackerCalls(const FieldDescriptor* field,
                                  const Options& opts) {
  Getters getters;
  if (field->is_repeated()) {
    getters = RepeatedFieldGetters(field, opts);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    const auto* oneof = field->real_containing_oneof();
    if (oneof != nullptr) {
      getters = StringOneofGetters(field, oneof, opts);
    } else {
      getters = StringFieldGetters(field, opts);
    }
  } else if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE ||
             IsExplicitLazy(field)) {
    getters = SingularFieldGetters(field, opts);
  }

  auto index = field->index();
  return GenerateTrackerCalls(
      opts, field->containing_type(),
      absl::Substitute("$0_AccessedNoStrip = true;", FieldName(field)),
      {
          Call(index, "get", "OnGet").Arg(getters.base),
          Call(index, "set", "OnSet").Arg(getters.base),
          Call(index, "has", "OnHas").Arg(getters.base),
          Call(index, "mutable", "OnMutable").Arg(getters.base),
          Call(index, "release", "OnRelease").Arg(getters.base),
          Call(index, "clear", "OnClear").Arg(getters.for_flat),
          Call(index, "size", "OnSize").Arg(getters.for_flat),
          Call(index, "list", "OnList").Arg(getters.for_flat),
          Call(index, "mutable_list", "OnMutableList").Arg(getters.for_flat),
          Call(index, "add", "OnAdd").Arg(getters.for_last),
          Call(index, "add_mutable", "OnAddMutable").Arg(getters.for_last),
      });
}